

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialogbuttonbox.cpp
# Opt level: O2

void QDialogButtonBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QFlagsStorage<QDialogButtonBox::StandardButton> *pQVar1;
  bool bVar2;
  QFlagsStorage<QDialogButtonBox::StandardButton> QVar3;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      clicked((QDialogButtonBox *)_o,*_a[1]);
      return;
    case 1:
      accepted((QDialogButtonBox *)_o);
      return;
    case 2:
      helpRequested((QDialogButtonBox *)_o);
      return;
    case 3:
      rejected((QDialogButtonBox *)_o);
      return;
    }
    break;
  case ReadProperty:
    pQVar1 = (QFlagsStorage<QDialogButtonBox::StandardButton> *)*_a;
    if (_id == 2) {
      *(undefined1 *)&pQVar1->i = *(undefined1 *)(*(long *)(_o + 8) + 0x468);
    }
    else {
      if (_id == 1) {
        QVar3.i = (Int)standardButtons((QDialogButtonBox *)_o);
      }
      else {
        if (_id != 0) {
          return;
        }
        QVar3.i = *(Int *)(*(long *)(_o + 8) + 0x450);
      }
      pQVar1->i = QVar3.i;
    }
    break;
  case WriteProperty:
    pQVar1 = (QFlagsStorage<QDialogButtonBox::StandardButton> *)*_a;
    if (_id == 2) {
      setCenterButtons((QDialogButtonBox *)_o,*(bool *)&pQVar1->i);
      return;
    }
    if (_id == 1) {
      setStandardButtons((QDialogButtonBox *)_o,(StandardButtons)pQVar1->i);
      return;
    }
    if (_id == 0) {
      setOrientation((QDialogButtonBox *)_o,pQVar1->i);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)(QAbstractButton*)>
                      ((QtMocHelpers *)_a,(void **)clicked,0,0);
    if (((!bVar2) &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                           ((QtMocHelpers *)_a,(void **)accepted,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                          ((QtMocHelpers *)_a,(void **)helpRequested,0,2), !bVar2)) {
      QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                ((QtMocHelpers *)_a,(void **)rejected,0,3);
      return;
    }
  }
  return;
}

Assistant:

void QDialogButtonBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialogButtonBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->helpRequested(); break;
        case 3: _t->rejected(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)(QAbstractButton * )>(_a, &QDialogButtonBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::helpRequested, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::rejected, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->centerButtons(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 2: _t->setCenterButtons(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}